

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  Pair *pPVar1;
  void *in_RDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::Pair> *in_RDI;
  Pair *it;
  Pair *it_00;
  ImVector<ImGuiStorage::Pair> *in_stack_ffffffffffffffd0;
  Pair *local_20;
  
  local_20 = LowerBound(in_RDI,in_ESI);
  it_00 = local_20;
  pPVar1 = ImVector<ImGuiStorage::Pair>::end(in_RDI);
  if ((it_00 == pPVar1) || (local_20->key != in_ESI)) {
    Pair::Pair((Pair *)&stack0xffffffffffffffd0,in_ESI,in_RDX);
    local_20 = ImVector<ImGuiStorage::Pair>::insert(in_stack_ffffffffffffffd0,it_00,(Pair *)in_RDI);
  }
  return (void **)&local_20->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_p;
}